

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::ArrayFeatureType::_InternalParse
          (ArrayFeatureType *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  int32_t iVar1;
  DefaultOptionalValueUnion DVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [12];
  bool bVar6;
  uint uVar7;
  ArrayFeatureType_EnumeratedShapes *msg;
  uint64_t value;
  uint32_t res;
  int iVar8;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  DefaultOptionalValueUnion *ptr_00;
  Arena *pAVar12;
  pair<const_char_*,_unsigned_int> pVar13;
  pair<const_char_*,_unsigned_long> pVar14;
  DefaultOptionalValueUnion *local_38;
  
  local_38 = (DefaultOptionalValueUnion *)ptr;
  bVar6 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar6) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar3 = *(byte *)local_38;
      uVar11 = (uint)bVar3;
      ptr_00 = (DefaultOptionalValueUnion *)((long)local_38 + 1);
      if ((char)bVar3 < '\0') {
        uVar11 = ((uint)bVar3 + (uint)*(byte *)ptr_00 * 0x80) - 0x80;
        if ((char)*(byte *)ptr_00 < '\0') {
          pVar13 = google::protobuf::internal::ReadTagFallback
                             ((char *)&local_38->intdefaultvalue_,uVar11);
          ptr_00 = (DefaultOptionalValueUnion *)pVar13.first;
          uVar11 = pVar13.second;
        }
        else {
          ptr_00 = (DefaultOptionalValueUnion *)((long)local_38 + 2);
        }
      }
      uVar7 = uVar11 >> 3;
      cVar10 = (char)uVar11;
      local_38 = ptr_00;
      if (uVar7 < 0x1f) {
        if (uVar7 == 1) {
          if (cVar10 == '\n') {
            local_38 = (DefaultOptionalValueUnion *)
                       google::protobuf::internal::PackedInt64Parser
                                 (&this->shape_,(char *)&ptr_00->intdefaultvalue_,ctx);
          }
          else {
            if ((uVar11 & 0xff) != 8) goto LAB_001f73f6;
            value = google::protobuf::internal::ReadVarint64((char **)&local_38);
            _internal_add_shape(this,value);
          }
          goto joined_r0x001f73ef;
        }
        if (uVar7 == 2) {
          if (cVar10 == '\x10') {
            uVar9 = (ulong)(char)*(byte *)ptr_00;
            local_38 = (DefaultOptionalValueUnion *)((long)ptr_00 + 1);
            if ((long)uVar9 < 0) {
              uVar11 = ((uint)*(byte *)local_38 * 0x80 + (uint)*(byte *)ptr_00) - 0x80;
              if (-1 < (char)*(byte *)local_38) {
                uVar9 = (ulong)uVar11;
                local_38 = (DefaultOptionalValueUnion *)((long)ptr_00 + 2);
                goto LAB_001f7345;
              }
              local_38 = ptr_00;
              pVar14 = google::protobuf::internal::VarintParseSlow64
                                 ((char *)&ptr_00->intdefaultvalue_,uVar11);
              iVar8 = (int)pVar14.second;
              local_38 = (DefaultOptionalValueUnion *)pVar14.first;
              if (local_38 == (DefaultOptionalValueUnion *)0x0) {
                return (char *)0x0;
              }
            }
            else {
LAB_001f7345:
              iVar8 = (int)uVar9;
            }
            this->datatype_ = iVar8;
            goto LAB_001f742b;
          }
        }
        else if ((uVar7 == 0x15) && (cVar10 == -0x56)) {
          if (this->_oneof_case_[0] == 0x15) goto LAB_001f72d8;
          clear_ShapeFlexibility(this);
          this->_oneof_case_[0] = 0x15;
          uVar9 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar12 = (Arena *)(uVar9 & 0xfffffffffffffffc);
          if ((uVar9 & 1) != 0) {
            pAVar12 = *(Arena **)pAVar12;
          }
          msg = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>
                          (pAVar12);
LAB_001f737a:
          (this->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)msg;
          goto LAB_001f7385;
        }
LAB_001f73f6:
        if ((uVar11 == 0) || ((uVar11 & 7) == 4)) {
          if (ptr_00 == (DefaultOptionalValueUnion *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar11 - 1;
          return (char *)ptr_00;
        }
        uVar9 = this_00->ptr_;
        if ((uVar9 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar9 & 0xfffffffffffffffc) + 8);
        }
        local_38 = (DefaultOptionalValueUnion *)
                   google::protobuf::internal::UnknownFieldParse
                             (uVar11,unknown,(char *)&local_38->intdefaultvalue_,ctx);
joined_r0x001f73ef:
        if (local_38 == (DefaultOptionalValueUnion *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        if (uVar7 < 0x33) {
          if (uVar7 == 0x1f) {
            if (cVar10 != -6) goto LAB_001f73f6;
            if (this->_oneof_case_[0] != 0x1f) {
              clear_ShapeFlexibility(this);
              this->_oneof_case_[0] = 0x1f;
              uVar9 = (this->super_MessageLite)._internal_metadata_.ptr_;
              pAVar12 = (Arena *)(uVar9 & 0xfffffffffffffffc);
              if ((uVar9 & 1) != 0) {
                pAVar12 = *(Arena **)pAVar12;
              }
              msg = (ArrayFeatureType_EnumeratedShapes *)
                    google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_ShapeRange>(pAVar12);
              goto LAB_001f737a;
            }
LAB_001f72d8:
            msg = (this->ShapeFlexibility_).enumeratedshapes_;
LAB_001f7385:
            local_38 = (DefaultOptionalValueUnion *)
                       google::protobuf::internal::ParseContext::ParseMessage
                                 (ctx,&msg->super_MessageLite,(char *)&local_38->intdefaultvalue_);
          }
          else {
            if ((uVar7 != 0x29) || (cVar10 != 'H')) goto LAB_001f73f6;
            bVar3 = *(byte *)ptr_00;
            auVar5[8] = bVar3;
            auVar5._0_8_ = (byte *)((long)ptr_00 + 1);
            auVar5._9_3_ = 0;
            if ((char)bVar3 < '\0') {
              bVar4 = *(byte *)((long)ptr_00 + 1);
              res = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
              if ((char)bVar4 < '\0') {
                pVar13 = google::protobuf::internal::VarintParseSlow32
                                   ((char *)&ptr_00->intdefaultvalue_,res);
                auVar5 = pVar13._0_12_;
              }
              else {
                auVar5._8_4_ = res;
                auVar5._0_8_ = (byte *)((long)ptr_00 + 2);
              }
            }
            local_38 = auVar5._0_8_;
            if (this->_oneof_case_[1] != 0x29) {
              this->_oneof_case_[1] = 0x29;
            }
            (this->defaultOptionalValue_).intdefaultvalue_ = auVar5._8_4_;
          }
          goto joined_r0x001f73ef;
        }
        if (uVar7 == 0x33) {
          if (cVar10 != -99) goto LAB_001f73f6;
          iVar1 = ptr_00->intdefaultvalue_;
          if (this->_oneof_case_[1] != 0x33) {
            this->_oneof_case_[1] = 0x33;
          }
          (this->defaultOptionalValue_).intdefaultvalue_ = iVar1;
          local_38 = (DefaultOptionalValueUnion *)((long)ptr_00 + 4);
        }
        else {
          if ((uVar7 != 0x3d) || (cVar10 != -0x17)) goto LAB_001f73f6;
          DVar2 = *ptr_00;
          if (this->_oneof_case_[1] != 0x3d) {
            this->_oneof_case_[1] = 0x3d;
          }
          this->defaultOptionalValue_ = DVar2;
          local_38 = ptr_00 + 1;
        }
      }
LAB_001f742b:
      bVar6 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar6);
  }
  return (char *)local_38;
}

Assistant:

const char* ArrayFeatureType::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated int64 shape = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt64Parser(_internal_mutable_shape(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 8) {
          _internal_add_shape(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_datatype(static_cast<::CoreML::Specification::ArrayFeatureType_ArrayDataType>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          ptr = ctx->ParseMessage(_internal_mutable_enumeratedshapes(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
      case 31:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 250)) {
          ptr = ctx->ParseMessage(_internal_mutable_shaperange(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 intDefaultValue = 41;
      case 41:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 72)) {
          _internal_set_intdefaultvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // float floatDefaultValue = 51;
      case 51:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 157)) {
          _internal_set_floatdefaultvalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr));
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // double doubleDefaultValue = 61;
      case 61:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 233)) {
          _internal_set_doubledefaultvalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}